

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse2_128_8.c
# Opt level: O2

parasail_result_t *
parasail_sw_diag_sse2_128_8
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined4 uVar8;
  undefined4 uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  parasail_result_t *ppVar17;
  int8_t *ptr;
  int8_t *ptr_00;
  int8_t *ptr_01;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  char *pcVar23;
  uint uVar24;
  char cVar25;
  char cVar26;
  uint uVar27;
  char *__format;
  int iVar28;
  int iVar29;
  ulong uVar30;
  uint uVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  undefined4 uVar37;
  undefined1 uVar44;
  undefined1 uVar45;
  undefined1 auVar38 [16];
  undefined1 uVar46;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  char cVar71;
  char cVar72;
  char cVar73;
  char cVar74;
  char cVar75;
  char cVar76;
  char cVar77;
  char cVar78;
  char cVar79;
  char cVar80;
  char cVar81;
  char cVar82;
  char cVar83;
  char cVar84;
  __m128i_8_t A;
  undefined1 auVar70 [16];
  char cVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  __m128i_8_t A_1;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  int8_t *local_260;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  short sStack_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  undefined1 local_248 [16];
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  char local_1d8;
  char cStack_1d7;
  char cStack_1d6;
  char cStack_1d5;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  ulong local_108;
  int *local_100;
  int *local_f8;
  int *local_f0;
  int *local_e8;
  ulong local_e0;
  char local_d8;
  char cStack_d7;
  char cStack_d6;
  char cStack_d5;
  char cStack_d4;
  char cStack_d3;
  char cStack_d2;
  char cStack_d1;
  char cStack_d0;
  char cStack_cf;
  char cStack_ce;
  char cStack_cd;
  char cStack_cc;
  char cStack_cb;
  char cStack_ca;
  char cStack_c9;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar23 = "_s2";
  }
  else if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar23 = "s2Len";
  }
  else if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar23 = "open";
  }
  else if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar23 = "gap";
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar23 = "matrix";
  }
  else {
    if (matrix->type != 0) {
      uVar20 = (ulong)(uint)matrix->length;
LAB_00513040:
      iVar33 = matrix->min;
      uVar18 = (uint)(byte)-(char)iVar33;
      if (iVar33 != -open && SBORROW4(iVar33,-open) == iVar33 + open < 0) {
        uVar18 = open;
      }
      cVar26 = (char)uVar18 + -0x7f;
      cVar25 = '~' - (char)matrix->max;
      auVar38 = pshuflw(ZEXT216(CONCAT11(cVar26,cVar26)),ZEXT216(CONCAT11(cVar26,cVar26)),0);
      uVar37 = auVar38._0_4_;
      local_1d8 = auVar38[0];
      cStack_1d7 = auVar38[1];
      cStack_1d6 = auVar38[2];
      cStack_1d5 = auVar38[3];
      local_118._4_4_ = uVar37;
      local_118._0_4_ = uVar37;
      local_118._8_4_ = uVar37;
      local_118._12_4_ = uVar37;
      ppVar17 = parasail_result_new();
      if (ppVar17 != (parasail_result_t *)0x0) {
        ppVar17->flag = ppVar17->flag | 0x10101004;
        uVar30 = (ulong)(s2Len + 0x1e);
        ptr = parasail_memalign_int8_t(0x10,uVar30);
        ptr_00 = parasail_memalign_int8_t(0x10,uVar30);
        ptr_01 = parasail_memalign_int8_t(0x10,uVar30);
        if (ptr_01 != (int8_t *)0x0 && (ptr_00 != (int8_t *)0x0 && ptr != (int8_t *)0x0)) {
          uVar18 = (uint)uVar20;
          lVar19 = (long)(int)uVar18;
          if (matrix->type == 0) {
            local_260 = parasail_memalign_int8_t(0x10,(long)(int)(uVar18 + 0xf));
            uVar30 = 0;
            if (local_260 == (int8_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar22 = 0;
            if (0 < (int)uVar18) {
              uVar22 = uVar20;
            }
            for (; lVar21 = lVar19, uVar22 != uVar30; uVar30 = uVar30 + 1) {
              local_260[uVar30] = (int8_t)matrix->mapper[(byte)_s1[uVar30]];
            }
            for (; lVar21 < (int)(uVar18 + 0xf); lVar21 = lVar21 + 1) {
              local_260[lVar21] = '\0';
            }
          }
          else {
            local_260 = (int8_t *)0x0;
          }
          uVar31 = s2Len + 0xf;
          auVar38 = ZEXT216(CONCAT11(cVar25,cVar25));
          auVar38 = pshuflw(auVar38,auVar38,0);
          local_d8 = auVar38[0];
          cStack_d7 = auVar38[1];
          cStack_d6 = auVar38[2];
          cStack_d5 = auVar38[3];
          local_98[4] = local_1d8;
          local_98._0_4_ = uVar37;
          local_98[5] = cStack_1d7;
          local_98[6] = cStack_1d6;
          local_98[7] = cStack_1d5;
          local_98[8] = local_1d8;
          local_98[9] = cStack_1d7;
          local_98[10] = cStack_1d6;
          local_98[0xb] = cStack_1d5;
          local_98[0xc] = local_1d8;
          local_98[0xd] = cStack_1d7;
          local_98[0xe] = cStack_1d6;
          local_98[0xf] = cStack_1d5;
          local_98 = local_98 >> 8;
          uVar46 = (undefined1)((uint)open >> 0x18);
          uVar45 = (undefined1)((uint)open >> 0x10);
          uVar44 = (undefined1)((uint)open >> 8);
          auVar39._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar46,uVar46),uVar45),CONCAT14(uVar45,open)) >>
                    0x20);
          auVar39[3] = uVar44;
          auVar39[2] = uVar44;
          auVar39[0] = (undefined1)open;
          auVar39[1] = auVar39[0];
          auVar39._8_8_ = 0;
          auVar39 = pshuflw(auVar39,auVar39,0);
          local_68 = auVar39._0_4_;
          uStack_64 = local_68;
          uStack_60 = local_68;
          uStack_5c = local_68;
          uVar46 = (undefined1)((uint)gap >> 0x18);
          uVar45 = (undefined1)((uint)gap >> 0x10);
          uVar44 = (undefined1)((uint)gap >> 8);
          auVar40._4_4_ =
               (int)(CONCAT35(CONCAT21(CONCAT11(uVar46,uVar46),uVar45),CONCAT14(uVar45,gap)) >> 0x20
                    );
          auVar40[3] = uVar44;
          auVar40[2] = uVar44;
          auVar40[0] = (undefined1)gap;
          auVar40[1] = auVar40[0];
          auVar40._8_8_ = 0;
          auVar39 = pshuflw(auVar40,auVar40,0);
          local_78 = auVar39._0_4_;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          auVar39 = pshuflw(ZEXT416(uVar18),ZEXT416(uVar18),0);
          local_a8 = auVar39._0_4_;
          uVar8 = local_a8;
          uStack_a4 = local_a8;
          uStack_a0 = local_a8;
          uStack_9c = local_a8;
          auVar40 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
          local_88 = auVar40._0_4_;
          uVar9 = local_88;
          uStack_84 = local_88;
          uStack_80 = local_88;
          uStack_7c = local_88;
          uVar30 = (ulong)(uint)s2Len;
          for (uVar20 = 0; uVar30 != uVar20; uVar20 = uVar20 + 1) {
            ptr[uVar20 + 0xf] = (int8_t)matrix->mapper[(byte)_s2[uVar20]];
          }
          for (lVar21 = 0; uVar20 = uVar30, lVar21 != 0xf; lVar21 = lVar21 + 1) {
            ptr[lVar21] = '\0';
          }
          for (; (int)uVar20 < (int)uVar31; uVar20 = uVar20 + 1) {
            ptr[uVar20 + 0xf] = '\0';
          }
          for (uVar20 = 0; uVar30 != uVar20; uVar20 = uVar20 + 1) {
            ptr_00[uVar20 + 0xf] = '\0';
            ptr_01[uVar20 + 0xf] = cVar26;
          }
          for (lVar21 = 0; lVar21 != 0xf; lVar21 = lVar21 + 1) {
            ptr_00[lVar21] = cVar26;
            ptr_01[lVar21] = cVar26;
          }
          for (; (int)uVar30 < (int)uVar31; uVar30 = uVar30 + 1) {
            ptr_00[uVar30 + 0xf] = cVar26;
            ptr_01[uVar30 + 0xf] = cVar26;
          }
          uVar18 = uVar18 - 1;
          uVar20 = 0;
          local_e0 = (ulong)uVar31;
          if ((int)uVar31 < 1) {
            local_e0 = uVar20;
          }
          local_1a8 = 0xf;
          sStack_1a6 = 0xe;
          sStack_1a4 = 0xd;
          sStack_1a2 = 0xc;
          sStack_1a0 = 0xb;
          sStack_19e = 10;
          sStack_19c = 9;
          sStack_19a = 8;
          local_218 = 7;
          sStack_216 = 6;
          sStack_214 = 5;
          sStack_212 = 4;
          sStack_210 = 3;
          sStack_20e = 2;
          sStack_20c = 1;
          sStack_20a = 0;
          local_b8[4] = local_1d8;
          local_b8._0_4_ = uVar37;
          local_b8[5] = cStack_1d7;
          local_b8[6] = cStack_1d6;
          local_b8[7] = cStack_1d5;
          local_b8[8] = local_1d8;
          local_b8[9] = cStack_1d7;
          local_b8[10] = cStack_1d6;
          local_b8[0xb] = cStack_1d5;
          local_b8[0xc] = local_1d8;
          local_b8[0xd] = cStack_1d7;
          local_b8[0xe] = cStack_1d6;
          local_b8[0xf] = cStack_1d5;
          local_168[4] = local_d8;
          local_168._0_4_ = auVar38._0_4_;
          local_168[5] = cStack_d7;
          local_168[6] = cStack_d6;
          local_168[7] = cStack_d5;
          local_168[0xc] = local_d8;
          local_168._8_4_ = auVar38._0_4_;
          local_168[0xd] = cStack_d7;
          local_168[0xe] = cStack_d6;
          local_168[0xf] = cStack_d5;
          local_138 = local_b8;
          local_118 = local_b8;
          local_c8 = local_b8;
          local_128 = local_b8;
          local_158 = local_b8;
          for (; (long)uVar20 < lVar19; uVar20 = uVar20 + 0x10) {
            local_108 = uVar20;
            if (matrix->type == 0) {
              uVar31 = (uint)local_260[uVar20];
              local_258 = (short)local_260[uVar20 + 1];
              sStack_256 = (short)(local_260[uVar20 + 1] >> 7);
              local_238 = (short)local_260[uVar20 + 2];
              sStack_236 = (short)(local_260[uVar20 + 2] >> 7);
              uVar35 = (uint)local_260[uVar20 + 3];
              uVar10 = (uint)local_260[uVar20 + 4];
              uVar32 = (uint)local_260[uVar20 + 5];
              uVar11 = (uint)local_260[uVar20 + 6];
              uVar34 = (uint)local_260[uVar20 + 7];
              uVar12 = (uint)local_260[uVar20 + 8];
              uVar24 = (uint)local_260[uVar20 + 9];
              uVar13 = (uint)local_260[uVar20 + 10];
              uVar36 = (uint)local_260[uVar20 + 0xb];
              uVar14 = (uint)local_260[uVar20 + 0xc];
              uVar27 = (uint)local_260[uVar20 + 0xd];
              uVar15 = (uint)local_260[uVar20 + 0xe];
              uVar16 = (int)local_260[uVar20 + 0xf];
            }
            else {
              uVar31 = (uint)uVar20;
              uVar35 = uVar31 | 1;
              if (lVar19 <= (long)(uVar20 | 1)) {
                uVar35 = uVar18;
              }
              local_258 = (short)uVar35;
              sStack_256 = (short)(uVar35 >> 0x10);
              uVar35 = uVar31 | 2;
              if (lVar19 <= (long)(uVar20 | 2)) {
                uVar35 = uVar18;
              }
              local_238 = (short)uVar35;
              sStack_236 = (short)(uVar35 >> 0x10);
              uVar35 = uVar31 | 3;
              if (lVar19 <= (long)(uVar20 | 3)) {
                uVar35 = uVar18;
              }
              uVar10 = uVar31 | 4;
              if (lVar19 <= (long)(uVar20 | 4)) {
                uVar10 = uVar18;
              }
              uVar32 = uVar31 | 5;
              if (lVar19 <= (long)(uVar20 | 5)) {
                uVar32 = uVar18;
              }
              uVar11 = uVar31 | 6;
              if (lVar19 <= (long)(uVar20 | 6)) {
                uVar11 = uVar18;
              }
              uVar34 = uVar31 | 7;
              if (lVar19 <= (long)(uVar20 | 7)) {
                uVar34 = uVar18;
              }
              uVar12 = uVar31 | 8;
              if (lVar19 <= (long)(uVar20 | 8)) {
                uVar12 = uVar18;
              }
              uVar24 = uVar31 | 9;
              if (lVar19 <= (long)(uVar20 | 9)) {
                uVar24 = uVar18;
              }
              uVar13 = uVar31 | 10;
              if (lVar19 <= (long)(uVar20 | 10)) {
                uVar13 = uVar18;
              }
              uVar36 = uVar31 | 0xb;
              if (lVar19 <= (long)(uVar20 | 0xb)) {
                uVar36 = uVar18;
              }
              uVar14 = uVar31 | 0xc;
              if (lVar19 <= (long)(uVar20 | 0xc)) {
                uVar14 = uVar18;
              }
              uVar27 = uVar31 | 0xd;
              if (lVar19 <= (long)(uVar20 | 0xd)) {
                uVar27 = uVar18;
              }
              uVar15 = uVar31 | 0xe;
              if (lVar19 <= (long)(uVar20 | 0xe)) {
                uVar15 = uVar18;
              }
              uVar16 = uVar31 | 0xf;
              if (lVar19 <= (long)(uVar20 | 0xf)) {
                uVar16 = uVar18;
              }
            }
            iVar33 = matrix->size;
            iVar29 = CONCAT22(sStack_256,local_258);
            iVar28 = CONCAT22(sStack_236,local_238);
            piVar1 = matrix->matrix;
            local_e8 = piVar1 + (int)(uVar27 * iVar33);
            local_f0 = piVar1 + (int)(uVar36 * iVar33);
            local_f8 = piVar1 + (int)(uVar24 * iVar33);
            local_100 = piVar1 + (int)(uVar35 * iVar33);
            local_a8._0_2_ = auVar39._0_2_;
            local_a8._2_2_ = auVar39._2_2_;
            auVar70._0_2_ = -(ushort)(local_1a8 < (short)local_a8);
            auVar70._2_2_ = -(ushort)(sStack_1a6 < local_a8._2_2_);
            auVar70._4_2_ = -(ushort)(sStack_1a4 < (short)local_a8);
            auVar70._6_2_ = -(ushort)(sStack_1a2 < local_a8._2_2_);
            auVar70._8_2_ = -(ushort)(sStack_1a0 < (short)local_a8);
            auVar70._10_2_ = -(ushort)(sStack_19e < local_a8._2_2_);
            auVar70._12_2_ = -(ushort)(sStack_19c < (short)local_a8);
            auVar70._14_2_ = -(ushort)(sStack_19a < local_a8._2_2_);
            auVar87._0_2_ = -(ushort)(local_218 < (short)local_a8);
            auVar87._2_2_ = -(ushort)(sStack_216 < local_a8._2_2_);
            auVar87._4_2_ = -(ushort)(sStack_214 < (short)local_a8);
            auVar87._6_2_ = -(ushort)(sStack_212 < local_a8._2_2_);
            auVar87._8_2_ = -(ushort)(sStack_210 < (short)local_a8);
            auVar87._10_2_ = -(ushort)(sStack_20e < local_a8._2_2_);
            auVar87._12_2_ = -(ushort)(sStack_20c < (short)local_a8);
            auVar87._14_2_ = -(ushort)(sStack_20a < local_a8._2_2_);
            local_58 = packsswb(auVar70,auVar87);
            auVar38[4] = local_1d8;
            auVar38._0_4_ = uVar37;
            auVar38[5] = cStack_1d7;
            auVar38[6] = cStack_1d6;
            auVar38[7] = cStack_1d5;
            auVar38[8] = local_1d8;
            auVar38[9] = cStack_1d7;
            auVar38[10] = cStack_1d6;
            auVar38[0xb] = cStack_1d5;
            auVar38[0xc] = local_1d8;
            auVar38[0xd] = cStack_1d7;
            auVar38[0xe] = cStack_1d6;
            auVar38[0xf] = cStack_1d5;
            local_258 = -0xf;
            sStack_256 = -0xe;
            sStack_254 = -0xd;
            sStack_252 = -0xc;
            sStack_250 = -0xb;
            sStack_24e = -10;
            sStack_24c = -9;
            sStack_24a = -8;
            local_238 = -7;
            sStack_236 = -6;
            sStack_234 = -5;
            sStack_232 = -4;
            sStack_230 = -3;
            sStack_22e = -2;
            sStack_22c = -1;
            sStack_22a = 0;
            auVar87 = local_98;
            auVar70 = local_98;
            local_248 = auVar38;
            for (uVar30 = 0; local_e0 != uVar30; uVar30 = uVar30 + 1) {
              auVar61 = ZEXT116((byte)ptr_00[uVar30 + 0xf]) << 0x78 | auVar70 >> 8;
              auVar7._4_4_ = local_68;
              auVar7._0_4_ = local_68;
              auVar7._8_4_ = local_68;
              auVar7._12_4_ = local_68;
              auVar62 = psubsb(auVar61,auVar7);
              auVar64._4_4_ = local_78;
              auVar64._0_4_ = local_78;
              auVar64._8_4_ = local_78;
              auVar64._12_4_ = local_78;
              auVar38 = psubsb(ZEXT116((byte)ptr_01[uVar30 + 0xf]) << 0x78 | auVar38 >> 8,auVar64);
              auVar47[0] = -(auVar38[0] < auVar62[0]);
              auVar47[1] = -(auVar38[1] < auVar62[1]);
              auVar47[2] = -(auVar38[2] < auVar62[2]);
              auVar47[3] = -(auVar38[3] < auVar62[3]);
              auVar47[4] = -(auVar38[4] < auVar62[4]);
              auVar47[5] = -(auVar38[5] < auVar62[5]);
              auVar47[6] = -(auVar38[6] < auVar62[6]);
              auVar47[7] = -(auVar38[7] < auVar62[7]);
              auVar47[8] = -(auVar38[8] < auVar62[8]);
              auVar47[9] = -(auVar38[9] < auVar62[9]);
              auVar47[10] = -(auVar38[10] < auVar62[10]);
              auVar47[0xb] = -(auVar38[0xb] < auVar62[0xb]);
              auVar47[0xc] = -(auVar38[0xc] < auVar62[0xc]);
              auVar47[0xd] = -(auVar38[0xd] < auVar62[0xd]);
              auVar47[0xe] = -(auVar38[0xe] < auVar62[0xe]);
              auVar47[0xf] = -(auVar38[0xf] < auVar62[0xf]);
              auVar47 = ~auVar47 & auVar38 | auVar62 & auVar47;
              auVar70 = psubsb(auVar70,auVar7);
              auVar38 = psubsb(local_248,auVar64);
              auVar63[0] = -(auVar38[0] < auVar70[0]);
              auVar63[1] = -(auVar38[1] < auVar70[1]);
              auVar63[2] = -(auVar38[2] < auVar70[2]);
              auVar63[3] = -(auVar38[3] < auVar70[3]);
              auVar63[4] = -(auVar38[4] < auVar70[4]);
              auVar63[5] = -(auVar38[5] < auVar70[5]);
              auVar63[6] = -(auVar38[6] < auVar70[6]);
              auVar63[7] = -(auVar38[7] < auVar70[7]);
              auVar63[8] = -(auVar38[8] < auVar70[8]);
              auVar63[9] = -(auVar38[9] < auVar70[9]);
              auVar63[10] = -(auVar38[10] < auVar70[10]);
              auVar63[0xb] = -(auVar38[0xb] < auVar70[0xb]);
              auVar63[0xc] = -(auVar38[0xc] < auVar70[0xc]);
              auVar63[0xd] = -(auVar38[0xd] < auVar70[0xd]);
              auVar63[0xe] = -(auVar38[0xe] < auVar70[0xe]);
              auVar63[0xf] = -(auVar38[0xf] < auVar70[0xf]);
              auVar64 = ~auVar63 & auVar38 | auVar70 & auVar63;
              auVar100[0xf] = (char)piVar1[(long)(int)(uVar31 * iVar33) + (long)ptr[uVar30 + 0xf]];
              auVar100[0xe] = (char)piVar1[(long)(iVar29 * iVar33) + (long)ptr[uVar30 + 0xe]];
              auVar100[0xd] = (char)piVar1[(long)(iVar28 * iVar33) + (long)ptr[uVar30 + 0xd]];
              auVar100[0xc] = (char)(piVar1 + (int)(uVar35 * iVar33))[ptr[uVar30 + 0xc]];
              auVar100[0xb] = (char)piVar1[(long)(int)(uVar10 * iVar33) + (long)ptr[uVar30 + 0xb]];
              auVar100[10] = (char)piVar1[(long)(int)(uVar32 * iVar33) + (long)ptr[uVar30 + 10]];
              auVar100[9] = (char)piVar1[(long)(int)(uVar11 * iVar33) + (long)ptr[uVar30 + 9]];
              auVar100[8] = (char)piVar1[(long)(int)(uVar34 * iVar33) + (long)ptr[uVar30 + 8]];
              auVar100[7] = (char)piVar1[(long)(int)(uVar12 * iVar33) + (long)ptr[uVar30 + 7]];
              auVar100[6] = (char)(piVar1 + (int)(uVar24 * iVar33))[ptr[uVar30 + 6]];
              auVar100[5] = (char)piVar1[(long)(int)(uVar13 * iVar33) + (long)ptr[uVar30 + 5]];
              auVar100[4] = (char)(piVar1 + (int)(uVar36 * iVar33))[ptr[uVar30 + 4]];
              auVar100[3] = (char)piVar1[(long)(int)(uVar14 * iVar33) + (long)ptr[uVar30 + 3]];
              auVar100[2] = (char)(piVar1 + (int)(uVar27 * iVar33))[ptr[uVar30 + 2]];
              auVar100[0] = (undefined1)piVar1[(long)(int)(uVar16 * iVar33) + (long)ptr[uVar30]];
              auVar100[1] = (char)piVar1[(long)(int)(uVar15 * iVar33) + (long)ptr[uVar30 + 1]];
              auVar38 = paddsb(auVar87,auVar100);
              auVar41[0] = -(auVar64[0] < auVar38[0]);
              auVar41[1] = -(auVar64[1] < auVar38[1]);
              auVar41[2] = -(auVar64[2] < auVar38[2]);
              auVar41[3] = -(auVar64[3] < auVar38[3]);
              auVar41[4] = -(auVar64[4] < auVar38[4]);
              auVar41[5] = -(auVar64[5] < auVar38[5]);
              auVar41[6] = -(auVar64[6] < auVar38[6]);
              auVar41[7] = -(auVar64[7] < auVar38[7]);
              auVar41[8] = -(auVar64[8] < auVar38[8]);
              auVar41[9] = -(auVar64[9] < auVar38[9]);
              auVar41[10] = -(auVar64[10] < auVar38[10]);
              auVar41[0xb] = -(auVar64[0xb] < auVar38[0xb]);
              auVar41[0xc] = -(auVar64[0xc] < auVar38[0xc]);
              auVar41[0xd] = -(auVar64[0xd] < auVar38[0xd]);
              auVar41[0xe] = -(auVar64[0xe] < auVar38[0xe]);
              auVar41[0xf] = -(auVar64[0xf] < auVar38[0xf]);
              auVar38 = ~auVar41 & auVar64 | auVar38 & auVar41;
              auVar67[0] = -(auVar47[0] < auVar38[0]);
              auVar67[1] = -(auVar47[1] < auVar38[1]);
              auVar67[2] = -(auVar47[2] < auVar38[2]);
              auVar67[3] = -(auVar47[3] < auVar38[3]);
              auVar67[4] = -(auVar47[4] < auVar38[4]);
              auVar67[5] = -(auVar47[5] < auVar38[5]);
              auVar67[6] = -(auVar47[6] < auVar38[6]);
              auVar67[7] = -(auVar47[7] < auVar38[7]);
              auVar67[8] = -(auVar47[8] < auVar38[8]);
              auVar67[9] = -(auVar47[9] < auVar38[9]);
              auVar67[10] = -(auVar47[10] < auVar38[10]);
              auVar67[0xb] = -(auVar47[0xb] < auVar38[0xb]);
              auVar67[0xc] = -(auVar47[0xc] < auVar38[0xc]);
              auVar67[0xd] = -(auVar47[0xd] < auVar38[0xd]);
              auVar67[0xe] = -(auVar47[0xe] < auVar38[0xe]);
              auVar67[0xf] = -(auVar47[0xf] < auVar38[0xf]);
              auVar38 = ~auVar67 & auVar47 | auVar38 & auVar67;
              auVar42[0] = -('\0' < auVar38[0]);
              auVar42[1] = -('\0' < auVar38[1]);
              auVar42[2] = -('\0' < auVar38[2]);
              auVar42[3] = -('\0' < auVar38[3]);
              auVar42[4] = -('\0' < auVar38[4]);
              auVar42[5] = -('\0' < auVar38[5]);
              auVar42[6] = -('\0' < auVar38[6]);
              auVar42[7] = -('\0' < auVar38[7]);
              auVar42[8] = -('\0' < auVar38[8]);
              auVar42[9] = -('\0' < auVar38[9]);
              auVar42[10] = -('\0' < auVar38[10]);
              auVar42[0xb] = -('\0' < auVar38[0xb]);
              auVar42[0xc] = -('\0' < auVar38[0xc]);
              auVar42[0xd] = -('\0' < auVar38[0xd]);
              auVar42[0xe] = -('\0' < auVar38[0xe]);
              auVar42[0xf] = -('\0' < auVar38[0xf]);
              auVar86._0_2_ = -(ushort)(local_258 == -1);
              auVar86._2_2_ = -(ushort)(sStack_256 == -1);
              auVar86._4_2_ = -(ushort)(sStack_254 == -1);
              auVar86._6_2_ = -(ushort)(sStack_252 == -1);
              auVar86._8_2_ = -(ushort)(sStack_250 == -1);
              auVar86._10_2_ = -(ushort)(sStack_24e == -1);
              auVar86._12_2_ = -(ushort)(sStack_24c == -1);
              auVar86._14_2_ = -(ushort)(sStack_24a == -1);
              auVar68._0_2_ = -(ushort)(local_238 == -1);
              auVar68._2_2_ = -(ushort)(sStack_236 == -1);
              auVar68._4_2_ = -(ushort)(sStack_234 == -1);
              auVar68._6_2_ = -(ushort)(sStack_232 == -1);
              auVar68._8_2_ = -(ushort)(sStack_230 == -1);
              auVar68._10_2_ = -(ushort)(sStack_22e == -1);
              auVar68._12_2_ = -(ushort)(sStack_22c == -1);
              auVar68._14_2_ = -(ushort)(sStack_22a == -1);
              auVar87 = packsswb(auVar86,auVar68);
              auVar70 = ~auVar87 & auVar42 & auVar38;
              auVar62[4] = local_1d8;
              auVar62._0_4_ = uVar37;
              auVar62[5] = cStack_1d7;
              auVar62[6] = cStack_1d6;
              auVar62[7] = cStack_1d5;
              auVar62[8] = local_1d8;
              auVar62[9] = cStack_1d7;
              auVar62[10] = cStack_1d6;
              auVar62[0xb] = cStack_1d5;
              auVar62[0xc] = local_1d8;
              auVar62[0xd] = cStack_1d7;
              auVar62[0xe] = cStack_1d6;
              auVar62[0xf] = cStack_1d5;
              auVar38 = ~auVar87 & auVar47 | auVar87 & auVar62;
              cVar25 = auVar70[0];
              cVar71 = auVar70[1];
              cVar85 = auVar70[0xf];
              cVar72 = auVar70[2];
              cVar73 = auVar70[3];
              cVar74 = auVar70[4];
              cVar75 = auVar70[5];
              cVar76 = auVar70[6];
              cVar77 = auVar70[7];
              cVar78 = auVar70[8];
              cVar79 = auVar70[9];
              cVar80 = auVar70[10];
              cVar81 = auVar70[0xb];
              cVar82 = auVar70[0xc];
              cVar83 = auVar70[0xd];
              cVar84 = auVar70[0xe];
              if (0xf < uVar30) {
                auVar48[0] = -(cVar25 < local_168[0]);
                auVar48[1] = -(cVar71 < local_168[1]);
                auVar48[2] = -(cVar72 < local_168[2]);
                auVar48[3] = -(cVar73 < local_168[3]);
                auVar48[4] = -(cVar74 < local_168[4]);
                auVar48[5] = -(cVar75 < local_168[5]);
                auVar48[6] = -(cVar76 < local_168[6]);
                auVar48[7] = -(cVar77 < local_168[7]);
                auVar48[8] = -(cVar78 < local_168[8]);
                auVar48[9] = -(cVar79 < local_168[9]);
                auVar48[10] = -(cVar80 < local_168[10]);
                auVar48[0xb] = -(cVar81 < local_168[0xb]);
                auVar48[0xc] = -(cVar82 < local_168[0xc]);
                auVar48[0xd] = -(cVar83 < local_168[0xd]);
                auVar48[0xe] = -(cVar84 < local_168[0xe]);
                auVar48[0xf] = -(cVar85 < local_168[0xf]);
                local_168 = ~auVar48 & local_168 | auVar70 & auVar48;
                auVar65[0] = -(cVar25 < local_158[0]);
                auVar65[1] = -(cVar71 < local_158[1]);
                auVar65[2] = -(cVar72 < local_158[2]);
                auVar65[3] = -(cVar73 < local_158[3]);
                auVar65[4] = -(cVar74 < local_158[4]);
                auVar65[5] = -(cVar75 < local_158[5]);
                auVar65[6] = -(cVar76 < local_158[6]);
                auVar65[7] = -(cVar77 < local_158[7]);
                auVar65[8] = -(cVar78 < local_158[8]);
                auVar65[9] = -(cVar79 < local_158[9]);
                auVar65[10] = -(cVar80 < local_158[10]);
                auVar65[0xb] = -(cVar81 < local_158[0xb]);
                auVar65[0xc] = -(cVar82 < local_158[0xc]);
                auVar65[0xd] = -(cVar83 < local_158[0xd]);
                auVar65[0xe] = -(cVar84 < local_158[0xe]);
                auVar65[0xf] = -(cVar85 < local_158[0xf]);
                local_158 = local_158 & auVar65 | ~auVar65 & auVar70;
              }
              local_248 = ~auVar87 & auVar64 | auVar87 & auVar62;
              auVar2._2_2_ = sStack_256;
              auVar2._0_2_ = local_258;
              auVar2._4_2_ = sStack_254;
              auVar2._6_2_ = sStack_252;
              auVar2._8_2_ = sStack_250;
              auVar2._10_2_ = sStack_24e;
              auVar2._12_2_ = sStack_24c;
              auVar2._14_2_ = sStack_24a;
              auVar43._0_2_ = -(ushort)(-1 < local_258);
              auVar43._2_2_ = -(ushort)(-1 < sStack_256);
              auVar43._4_2_ = -(ushort)(-1 < sStack_254);
              auVar43._6_2_ = -(ushort)(-1 < sStack_252);
              auVar43._8_2_ = -(ushort)(-1 < sStack_250);
              auVar43._10_2_ = -(ushort)(-1 < sStack_24e);
              auVar43._12_2_ = -(ushort)(-1 < sStack_24c);
              auVar43._14_2_ = -(ushort)(-1 < sStack_24a);
              auVar3._2_2_ = sStack_236;
              auVar3._0_2_ = local_238;
              auVar3._4_2_ = sStack_234;
              auVar3._6_2_ = sStack_232;
              auVar3._8_2_ = sStack_230;
              auVar3._10_2_ = sStack_22e;
              auVar3._12_2_ = sStack_22c;
              auVar3._14_2_ = sStack_22a;
              auVar49._0_2_ = -(ushort)(-1 < local_238);
              auVar49._2_2_ = -(ushort)(-1 < sStack_236);
              auVar49._4_2_ = -(ushort)(-1 < sStack_234);
              auVar49._6_2_ = -(ushort)(-1 < sStack_232);
              auVar49._8_2_ = -(ushort)(-1 < sStack_230);
              auVar49._10_2_ = -(ushort)(-1 < sStack_22e);
              auVar49._12_2_ = -(ushort)(-1 < sStack_22c);
              auVar49._14_2_ = -(ushort)(-1 < sStack_22a);
              auVar87 = packsswb(auVar43,auVar49);
              local_88._0_2_ = auVar40._0_2_;
              local_88._2_2_ = auVar40._2_2_;
              auVar69._0_2_ = -(ushort)(local_258 < (short)local_88);
              auVar69._2_2_ = -(ushort)(sStack_256 < local_88._2_2_);
              auVar69._4_2_ = -(ushort)(sStack_254 < (short)local_88);
              auVar69._6_2_ = -(ushort)(sStack_252 < local_88._2_2_);
              auVar69._8_2_ = -(ushort)(sStack_250 < (short)local_88);
              auVar69._10_2_ = -(ushort)(sStack_24e < local_88._2_2_);
              auVar69._12_2_ = -(ushort)(sStack_24c < (short)local_88);
              auVar69._14_2_ = -(ushort)(sStack_24a < local_88._2_2_);
              auVar50._0_2_ = -(ushort)(local_238 < (short)local_88);
              auVar50._2_2_ = -(ushort)(sStack_236 < local_88._2_2_);
              auVar50._4_2_ = -(ushort)(sStack_234 < (short)local_88);
              auVar50._6_2_ = -(ushort)(sStack_232 < local_88._2_2_);
              auVar50._8_2_ = -(ushort)(sStack_230 < (short)local_88);
              auVar50._10_2_ = -(ushort)(sStack_22e < local_88._2_2_);
              auVar50._12_2_ = -(ushort)(sStack_22c < (short)local_88);
              auVar50._14_2_ = -(ushort)(sStack_22a < local_88._2_2_);
              auVar62 = packsswb(auVar69,auVar50);
              auVar87 = auVar62 & local_58 & auVar87;
              auVar98[0] = -(cVar25 == local_118[0]);
              auVar98[1] = -(cVar71 == local_118[1]);
              auVar98[2] = -(cVar72 == local_118[2]);
              auVar98[3] = -(cVar73 == local_118[3]);
              auVar98[4] = -(cVar74 == local_118[4]);
              auVar98[5] = -(cVar75 == local_118[5]);
              auVar98[6] = -(cVar76 == local_118[6]);
              auVar98[7] = -(cVar77 == local_118[7]);
              auVar98[8] = -(cVar78 == local_118[8]);
              auVar98[9] = -(cVar79 == local_118[9]);
              auVar98[10] = -(cVar80 == local_118[10]);
              auVar98[0xb] = -(cVar81 == local_118[0xb]);
              auVar98[0xc] = -(cVar82 == local_118[0xc]);
              auVar98[0xd] = -(cVar83 == local_118[0xd]);
              auVar98[0xe] = -(cVar84 == local_118[0xe]);
              auVar98[0xf] = -(cVar85 == local_118[0xf]);
              auVar96[0] = -(local_118[0] < cVar25);
              auVar96[1] = -(local_118[1] < cVar71);
              auVar96[2] = -(local_118[2] < cVar72);
              auVar96[3] = -(local_118[3] < cVar73);
              auVar96[4] = -(local_118[4] < cVar74);
              auVar96[5] = -(local_118[5] < cVar75);
              auVar96[6] = -(local_118[6] < cVar76);
              auVar96[7] = -(local_118[7] < cVar77);
              auVar96[8] = -(local_118[8] < cVar78);
              auVar96[9] = -(local_118[9] < cVar79);
              auVar96[10] = -(local_118[10] < cVar80);
              auVar96[0xb] = -(local_118[0xb] < cVar81);
              auVar96[0xc] = -(local_118[0xc] < cVar82);
              auVar96[0xd] = -(local_118[0xd] < cVar83);
              auVar96[0xe] = -(local_118[0xe] < cVar84);
              auVar96[0xf] = -(local_118[0xf] < cVar85);
              auVar96 = auVar96 & auVar87;
              auVar66[1] = auVar96[8];
              auVar66[0] = auVar96[8];
              auVar66[2] = auVar96[9];
              auVar66[3] = auVar96[9];
              auVar66[4] = auVar96[10];
              auVar66[5] = auVar96[10];
              auVar66[6] = auVar96[0xb];
              auVar66[7] = auVar96[0xb];
              auVar66[8] = auVar96[0xc];
              auVar66[9] = auVar96[0xc];
              auVar66[10] = auVar96[0xd];
              auVar66[0xb] = auVar96[0xd];
              auVar66[0xc] = auVar96[0xe];
              auVar66[0xd] = auVar96[0xe];
              auVar66[0xf] = auVar96[0xf];
              auVar66[0xe] = auVar66[0xf];
              auVar4._2_2_ = sStack_216;
              auVar4._0_2_ = local_218;
              auVar4._4_2_ = sStack_214;
              auVar4._6_2_ = sStack_212;
              auVar4._8_2_ = sStack_210;
              auVar4._10_2_ = sStack_20e;
              auVar4._12_2_ = sStack_20c;
              auVar4._14_2_ = sStack_20a;
              auVar97._0_2_ = -(ushort)(local_258 < local_b8._0_2_);
              auVar97._2_2_ = -(ushort)(sStack_256 < local_b8._2_2_);
              auVar97._4_2_ = -(ushort)(sStack_254 < local_b8._4_2_);
              auVar97._6_2_ = -(ushort)(sStack_252 < local_b8._6_2_);
              auVar97._8_2_ = -(ushort)(sStack_250 < local_b8._8_2_);
              auVar97._10_2_ = -(ushort)(sStack_24e < local_b8._10_2_);
              auVar97._12_2_ = -(ushort)(sStack_24c < local_b8._12_2_);
              auVar97._14_2_ = -(ushort)(sStack_24a < local_b8._14_2_);
              auVar51._0_2_ = -(ushort)(local_238 < local_c8._0_2_);
              auVar51._2_2_ = -(ushort)(sStack_236 < local_c8._2_2_);
              auVar51._4_2_ = -(ushort)(sStack_234 < local_c8._4_2_);
              auVar51._6_2_ = -(ushort)(sStack_232 < local_c8._6_2_);
              auVar51._8_2_ = -(ushort)(sStack_230 < local_c8._8_2_);
              auVar51._10_2_ = -(ushort)(sStack_22e < local_c8._10_2_);
              auVar51._12_2_ = -(ushort)(sStack_22c < local_c8._12_2_);
              auVar51._14_2_ = -(ushort)(sStack_22a < local_c8._14_2_);
              auVar62 = packsswb(auVar97,auVar51);
              auVar59._0_14_ = auVar96._0_14_;
              auVar59[0xe] = auVar96[7];
              auVar59[0xf] = auVar96[7];
              auVar58._14_2_ = auVar59._14_2_;
              auVar58._0_13_ = auVar96._0_13_;
              auVar58[0xd] = auVar96[6];
              auVar57._13_3_ = auVar58._13_3_;
              auVar57._0_12_ = auVar96._0_12_;
              auVar57[0xc] = auVar96[6];
              auVar56._12_4_ = auVar57._12_4_;
              auVar56._0_11_ = auVar96._0_11_;
              auVar56[0xb] = auVar96[5];
              auVar55._11_5_ = auVar56._11_5_;
              auVar55._0_10_ = auVar96._0_10_;
              auVar55[10] = auVar96[5];
              auVar54._10_6_ = auVar55._10_6_;
              auVar54._0_9_ = auVar96._0_9_;
              auVar54[9] = auVar96[4];
              auVar53._9_7_ = auVar54._9_7_;
              auVar53._0_8_ = auVar96._0_8_;
              auVar53[8] = auVar96[4];
              auVar52._8_8_ = auVar53._8_8_;
              auVar52[7] = auVar96[3];
              auVar52[6] = auVar96[3];
              auVar52[5] = auVar96[2];
              auVar52[4] = auVar96[2];
              auVar52[3] = auVar96[1];
              auVar52[2] = auVar96[1];
              auVar52[0] = auVar96[0];
              auVar52[1] = auVar52[0];
              local_118 = ~auVar96 & local_118 | auVar70 & auVar96;
              auVar6._2_2_ = sStack_1a6;
              auVar6._0_2_ = local_1a8;
              auVar6._4_2_ = sStack_1a4;
              auVar6._6_2_ = sStack_1a2;
              auVar6._8_2_ = sStack_1a0;
              auVar6._10_2_ = sStack_19e;
              auVar6._12_2_ = sStack_19c;
              auVar6._14_2_ = sStack_19a;
              auVar98 = auVar62 & auVar87 & auVar98;
              auVar95._0_14_ = auVar98._0_14_;
              auVar95[0xe] = auVar98[7];
              auVar95[0xf] = auVar98[7];
              auVar94._14_2_ = auVar95._14_2_;
              auVar94._0_13_ = auVar98._0_13_;
              auVar94[0xd] = auVar98[6];
              auVar93._13_3_ = auVar94._13_3_;
              auVar93._0_12_ = auVar98._0_12_;
              auVar93[0xc] = auVar98[6];
              auVar92._12_4_ = auVar93._12_4_;
              auVar92._0_11_ = auVar98._0_11_;
              auVar92[0xb] = auVar98[5];
              auVar91._11_5_ = auVar92._11_5_;
              auVar91._0_10_ = auVar98._0_10_;
              auVar91[10] = auVar98[5];
              auVar90._10_6_ = auVar91._10_6_;
              auVar90._0_9_ = auVar98._0_9_;
              auVar90[9] = auVar98[4];
              auVar89._9_7_ = auVar90._9_7_;
              auVar89._0_8_ = auVar98._0_8_;
              auVar89[8] = auVar98[4];
              auVar88._8_8_ = auVar89._8_8_;
              auVar88[7] = auVar98[3];
              auVar88[6] = auVar98[3];
              auVar88[5] = auVar98[2];
              auVar88[4] = auVar98[2];
              auVar88[3] = auVar98[1];
              auVar88[2] = auVar98[1];
              auVar88[0] = auVar98[0];
              auVar88[1] = auVar88[0];
              auVar99[1] = auVar98[8];
              auVar99[0] = auVar98[8];
              auVar99[2] = auVar98[9];
              auVar99[3] = auVar98[9];
              auVar99[4] = auVar98[10];
              auVar99[5] = auVar98[10];
              auVar99[6] = auVar98[0xb];
              auVar99[7] = auVar98[0xb];
              auVar99[8] = auVar98[0xc];
              auVar99[9] = auVar98[0xc];
              auVar99[10] = auVar98[0xd];
              auVar99[0xb] = auVar98[0xd];
              auVar99[0xc] = auVar98[0xe];
              auVar99[0xd] = auVar98[0xe];
              auVar99[0xf] = auVar98[0xf];
              auVar99[0xe] = auVar99[0xf];
              local_128 = auVar6 & auVar88 | ~auVar88 & (auVar6 & auVar52 | ~auVar52 & local_128);
              auVar5._2_2_ = sStack_216;
              auVar5._0_2_ = local_218;
              auVar5._4_2_ = sStack_214;
              auVar5._6_2_ = sStack_212;
              auVar5._8_2_ = sStack_210;
              auVar5._10_2_ = sStack_20e;
              auVar5._12_2_ = sStack_20c;
              auVar5._14_2_ = sStack_20a;
              local_138 = auVar5 & auVar99 | ~auVar99 & (auVar4 & auVar66 | ~auVar66 & local_138);
              local_b8 = ~auVar88 & (~auVar52 & local_b8 | auVar2 & auVar52) | auVar2 & auVar88;
              local_c8 = ~auVar99 & (~auVar66 & local_c8 | auVar3 & auVar66) | auVar3 & auVar99;
              local_48 = auVar70;
              ptr_00[uVar30] = cVar25;
              ptr_01[uVar30] = auVar38[0];
              local_258 = local_258 + 1;
              sStack_256 = sStack_256 + 1;
              sStack_254 = sStack_254 + 1;
              sStack_252 = sStack_252 + 1;
              sStack_250 = sStack_250 + 1;
              sStack_24e = sStack_24e + 1;
              sStack_24c = sStack_24c + 1;
              sStack_24a = sStack_24a + 1;
              local_238 = local_238 + 1;
              sStack_236 = sStack_236 + 1;
              sStack_234 = sStack_234 + 1;
              sStack_232 = sStack_232 + 1;
              sStack_230 = sStack_230 + 1;
              sStack_22e = sStack_22e + 1;
              sStack_22c = sStack_22c + 1;
              sStack_22a = sStack_22a + 1;
              auVar87 = auVar61;
            }
            local_1a8 = local_1a8 + 0x10;
            sStack_1a6 = sStack_1a6 + 0x10;
            sStack_1a4 = sStack_1a4 + 0x10;
            sStack_1a2 = sStack_1a2 + 0x10;
            sStack_1a0 = sStack_1a0 + 0x10;
            sStack_19e = sStack_19e + 0x10;
            sStack_19c = sStack_19c + 0x10;
            sStack_19a = sStack_19a + 0x10;
            local_218 = local_218 + 0x10;
            sStack_216 = sStack_216 + 0x10;
            sStack_214 = sStack_214 + 0x10;
            sStack_212 = sStack_212 + 0x10;
            sStack_210 = sStack_210 + 0x10;
            sStack_20e = sStack_20e + 0x10;
            sStack_20c = sStack_20c + 0x10;
            sStack_20a = sStack_20a + 0x10;
          }
          iVar29 = 0;
          iVar33 = 0;
          for (lVar19 = 0; (int)lVar19 != 8; lVar19 = lVar19 + 1) {
            cVar25 = local_118[lVar19];
            if (cVar26 < cVar25) {
              iVar33 = (int)*(short *)(local_128 + lVar19 * 2);
              iVar29 = (int)*(short *)(local_b8 + lVar19 * 2);
              cVar26 = cVar25;
            }
            else if (cVar25 == cVar26) {
              iVar28 = (int)*(short *)(local_b8 + lVar19 * 2);
              if (iVar28 < iVar29) {
                iVar33 = (int)*(short *)(local_128 + lVar19 * 2);
                iVar29 = iVar28;
              }
              else if ((iVar29 == iVar28) && (*(short *)(local_128 + lVar19 * 2) <= iVar33)) {
                iVar33 = (int)*(short *)(local_128 + lVar19 * 2);
              }
            }
          }
          for (lVar19 = 0; (int)lVar19 != 8; lVar19 = lVar19 + 1) {
            cVar25 = local_118[lVar19 + 8];
            if (cVar26 < cVar25) {
              iVar33 = (int)*(short *)(local_138 + lVar19 * 2);
              iVar29 = (int)*(short *)(local_c8 + lVar19 * 2);
              cVar26 = cVar25;
            }
            else if (cVar25 == cVar26) {
              iVar28 = (int)*(short *)(local_c8 + lVar19 * 2);
              if (iVar28 < iVar29) {
                iVar33 = (int)*(short *)(local_138 + lVar19 * 2);
                iVar29 = iVar28;
              }
              else if ((iVar29 == iVar28) && (*(short *)(local_138 + lVar19 * 2) <= iVar33)) {
                iVar33 = (int)*(short *)(local_138 + lVar19 * 2);
              }
            }
          }
          auVar61[0] = -(local_168[0] < local_1d8);
          auVar61[1] = -(local_168[1] < cStack_1d7);
          auVar61[2] = -(local_168[2] < cStack_1d6);
          auVar61[3] = -(local_168[3] < cStack_1d5);
          auVar61[4] = -(local_168[4] < local_1d8);
          auVar61[5] = -(local_168[5] < cStack_1d7);
          auVar61[6] = -(local_168[6] < cStack_1d6);
          auVar61[7] = -(local_168[7] < cStack_1d5);
          auVar61[8] = -(local_168[8] < local_1d8);
          auVar61[9] = -(local_168[9] < cStack_1d7);
          auVar61[10] = -(local_168[10] < cStack_1d6);
          auVar61[0xb] = -(local_168[0xb] < cStack_1d5);
          auVar61[0xc] = -(local_168[0xc] < local_1d8);
          auVar61[0xd] = -(local_168[0xd] < cStack_1d7);
          auVar61[0xe] = -(local_168[0xe] < cStack_1d6);
          auVar61[0xf] = -(local_168[0xf] < cStack_1d5);
          auVar60[0] = -(local_d8 < local_158[0]);
          auVar60[1] = -(cStack_d7 < local_158[1]);
          auVar60[2] = -(cStack_d6 < local_158[2]);
          auVar60[3] = -(cStack_d5 < local_158[3]);
          auVar60[4] = -(local_d8 < local_158[4]);
          auVar60[5] = -(cStack_d7 < local_158[5]);
          auVar60[6] = -(cStack_d6 < local_158[6]);
          auVar60[7] = -(cStack_d5 < local_158[7]);
          auVar60[8] = -(local_d8 < local_158[8]);
          auVar60[9] = -(cStack_d7 < local_158[9]);
          auVar60[10] = -(cStack_d6 < local_158[10]);
          auVar60[0xb] = -(cStack_d5 < local_158[0xb]);
          auVar60[0xc] = -(local_d8 < local_158[0xc]);
          auVar60[0xd] = -(cStack_d7 < local_158[0xd]);
          auVar60[0xe] = -(cStack_d6 < local_158[0xe]);
          auVar60[0xf] = -(cStack_d5 < local_158[0xf]);
          auVar60 = auVar60 | auVar61;
          if ((((((((((((((((auVar60 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar60 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar60 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar60 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar60 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar60 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar60 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar60 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar60 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar60 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar60 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar60 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar60[0xf] < '\0') {
            *(byte *)&ppVar17->flag = (byte)ppVar17->flag | 0x40;
            cVar26 = '\0';
            iVar29 = 0;
            iVar33 = 0;
          }
          ppVar17->score = (int)cVar26;
          ppVar17->end_query = iVar33;
          ppVar17->end_ref = iVar29;
          cStack_d4 = local_d8;
          cStack_d3 = cStack_d7;
          cStack_d2 = cStack_d6;
          cStack_d1 = cStack_d5;
          cStack_d0 = local_d8;
          cStack_cf = cStack_d7;
          cStack_ce = cStack_d6;
          cStack_cd = cStack_d5;
          cStack_cc = local_d8;
          cStack_cb = cStack_d7;
          cStack_ca = cStack_d6;
          cStack_c9 = cStack_d5;
          local_a8 = uVar8;
          local_88 = uVar9;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(local_260);
            return ppVar17;
          }
          return ppVar17;
        }
      }
      return (parasail_result_t *)0x0;
    }
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar23 = "_s1";
    }
    else {
      uVar20 = (ulong)(uint)_s1Len;
      if (0 < _s1Len) goto LAB_00513040;
      __format = "%s: %s must be > 0\n";
      pcVar23 = "_s1Len";
    }
  }
  fprintf(_stderr,__format,"parasail_sw_diag_sse2_128_8",pcVar23);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int8_t * restrict s1 = NULL;
    int8_t * restrict s2B = NULL;
    int8_t * restrict _H_pr = NULL;
    int8_t * restrict _F_pr = NULL;
    int8_t * restrict s2 = NULL;
    int8_t * restrict H_pr = NULL;
    int8_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne16;
    __m128i vNegOne16;
    __m128i vN16;
    __m128i vILo16;
    __m128i vIHi16;
    __m128i vJresetLo16;
    __m128i vJresetHi16;
    __m128i vMaxH;
    __m128i vEndILo;
    __m128i vEndIHi;
    __m128i vEndJLo;
    __m128i vEndJHi;
    __m128i vILimit16;
    __m128i vJLimit16;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi8(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 1); /* shift in a 0 */
    vOpen = _mm_set1_epi8(open);
    vGap  = _mm_set1_epi8(gap);
    vZero = _mm_set1_epi8(0);
    vOne16 = _mm_set1_epi16(1);
    vNegOne16 = _mm_set1_epi16(-1);
    vN16 = _mm_set1_epi16(N);
    vILo16 = _mm_set_epi16(8,9,10,11,12,13,14,15);
    vIHi16 = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJresetLo16 = _mm_set_epi16(-8,-9,-10,-11,-12,-13,-14,-15);
    vJresetHi16 = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vEndILo = vNegInf;
    vEndIHi = vNegInf;
    vEndJLo = vNegInf;
    vEndJHi = vNegInf;
    vILimit16 = _mm_set1_epi16(s1Len);
    vJLimit16 = _mm_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int8_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int8_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int8_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int8_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJLo16 = vJresetLo16;
        __m128i vJHi16 = vJresetHi16;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        __m128i vIltLimit = _mm_packs_epi16(
                    _mm_cmplt_epi16(vILo16, vILimit16),
                    _mm_cmplt_epi16(vIHi16, vILimit16));
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 1);
            vNH = _mm_insert_epi8_rpl(vNH, H_pr[j], 15);
            vF = _mm_srli_si128(vF, 1);
            vF = _mm_insert_epi8_rpl(vF, F_pr[j], 15);
            vF = _mm_max_epi8_rpl(
                    _mm_subs_epi8(vNH, vOpen),
                    _mm_subs_epi8(vF, vGap));
            vE = _mm_max_epi8_rpl(
                    _mm_subs_epi8(vWH, vOpen),
                    _mm_subs_epi8(vE, vGap));
            vMat = _mm_set_epi8(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm_adds_epi8(vNWH, vMat);
            vWH = _mm_max_epi8_rpl(vNWH, vE);
            vWH = _mm_max_epi8_rpl(vWH, vF);
            vWH = _mm_max_epi8_rpl(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_packs_epi16(
                        _mm_cmpeq_epi16(vJLo16,vNegOne16),
                        _mm_cmpeq_epi16(vJHi16,vNegOne16));
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int8_t)_mm_extract_epi8_rpl(vWH,0);
            F_pr[j-15] = (int8_t)_mm_extract_epi8_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_packs_epi16(
                            _mm_cmpgt_epi16(vJLo16, vNegOne16),
                            _mm_cmpgt_epi16(vJHi16, vNegOne16)),
                        _mm_packs_epi16(
                            _mm_cmplt_epi16(vJLo16, vJLimit16),
                            _mm_cmplt_epi16(vJHi16, vJLimit16)));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi8(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi8(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_packs_epi16(
                        _mm_cmplt_epi16(vJLo16, vEndJLo),
                        _mm_cmplt_epi16(vJHi16, vEndJHi));
                __m128i cond_lo = _mm_unpacklo_epi8(cond_all, cond_all);
                __m128i cond_hi = _mm_unpackhi_epi8(cond_all, cond_all);
                vMaxH = _mm_blendv_epi8_rpl(vMaxH, vWH, cond_all);
                vEndILo = _mm_blendv_epi8_rpl(vEndILo, vILo16, cond_lo);
                vEndIHi = _mm_blendv_epi8_rpl(vEndIHi, vIHi16, cond_hi);
                vEndJLo = _mm_blendv_epi8_rpl(vEndJLo, vJLo16, cond_lo);
                vEndJHi = _mm_blendv_epi8_rpl(vEndJHi, vJHi16, cond_hi);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                cond_lo = _mm_unpacklo_epi8(cond_all, cond_all);
                cond_hi = _mm_unpackhi_epi8(cond_all, cond_all);
                vEndILo = _mm_blendv_epi8_rpl(vEndILo, vILo16, cond_lo);
                vEndIHi = _mm_blendv_epi8_rpl(vEndIHi, vIHi16, cond_hi);
                vEndJLo = _mm_blendv_epi8_rpl(vEndJLo, vJLo16, cond_lo);
                vEndJHi = _mm_blendv_epi8_rpl(vEndJHi, vJHi16, cond_hi);
            }
            vJLo16 = _mm_add_epi16(vJLo16, vOne16);
            vJHi16 = _mm_add_epi16(vJHi16, vOne16);
        }
        vILo16 = _mm_add_epi16(vILo16, vN16);
        vIHi16 = _mm_add_epi16(vIHi16, vN16);
    }

    /* alignment ending position */
    {
        int8_t *t = (int8_t*)&vMaxH;
        int16_t *ilo = (int16_t*)&vEndILo;
        int16_t *jlo = (int16_t*)&vEndJLo;
        int16_t *ihi = (int16_t*)&vEndIHi;
        int16_t *jhi = (int16_t*)&vEndJHi;
        int32_t k;
        for (k=0; k<N/2; ++k, ++t, ++ilo, ++jlo) {
            if (*t > score) {
                score = *t;
                end_query = *ilo;
                end_ref = *jlo;
            }
            else if (*t == score) {
                if (*jlo < end_ref) {
                    end_query = *ilo;
                    end_ref = *jlo;
                }
                else if (*jlo == end_ref && *ilo < end_query) {
                    end_query = *ilo;
                    end_ref = *jlo;
                }
            }
        }
        for (k=N/2; k<N; ++k, ++t, ++ihi, ++jhi) {
            if (*t > score) {
                score = *t;
                end_query = *ihi;
                end_ref = *jhi;
            }
            else if (*t == score) {
                if (*jhi < end_ref) {
                    end_query = *ihi;
                    end_ref = *jhi;
                }
                else if (*jhi == end_ref && *ihi < end_query) {
                    end_query = *ihi;
                    end_ref = *jhi;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}